

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

base_learner * kernel_svm_setup(options_i *options,vw *all)

{
  bool bVar1;
  int iVar2;
  option_group_definition *poVar3;
  typed_option<unsigned_long> *ptVar4;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *op
  ;
  typed_option<float> *op_00;
  typed_option<int> *op_01;
  loss_function *plVar5;
  svm_model *psVar6;
  svm_example **ppsVar7;
  ulong uVar8;
  ostream *poVar9;
  double *pdVar10;
  int *piVar11;
  learner<svm_params,_example> *plVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  bool ksvm;
  free_ptr<svm_params> params;
  int degree;
  float bandwidth;
  allocator local_8d3;
  allocator local_8d2;
  allocator local_8d1;
  allocator local_8d0;
  allocator local_8cf;
  allocator local_8ce;
  allocator local_8cd;
  allocator local_8cc;
  allocator local_8cb;
  allocator local_8ca;
  allocator local_8c9;
  allocator local_8c8;
  allocator local_8c7;
  allocator local_8c6;
  allocator local_8c5;
  allocator local_8c4;
  allocator local_8c3;
  allocator local_8c2;
  allocator local_8c1;
  string kernel_type;
  string local_8a0;
  string local_880 [32];
  string local_860;
  string local_840 [32];
  string local_820;
  string local_800 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  string local_7c0;
  string local_7a0 [32];
  string local_780;
  string local_760 [32];
  string local_740;
  string local_720 [32];
  string local_700;
  string local_6e0 [32];
  string local_6c0;
  string local_6a0 [32];
  string local_680;
  string local_660 [32];
  string local_640;
  string local_620;
  option_group_definition new_options;
  string loss_function;
  string local_598 [64];
  bool local_558;
  typed_option<unsigned_long> local_528;
  undefined1 local_488 [160];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  undefined1 local_348 [160];
  typed_option<int> local_2a8;
  typed_option<float> local_208;
  typed_option<unsigned_long> local_168;
  typed_option<unsigned_long> local_c8;
  
  scoped_calloc_or_throw<svm_params>();
  kernel_type._M_dataplus._M_p = (pointer)&kernel_type.field_2;
  kernel_type._M_string_length = 0;
  kernel_type.field_2._M_local_buf[0] = '\0';
  bandwidth = 1.0;
  degree = 2;
  ksvm = false;
  std::__cxx11::string::string((string *)&local_620,"Kernel SVM",(allocator *)&loss_function);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::string((string *)&local_640,"ksvm",&local_8c1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&loss_function,&local_640,&ksvm);
  local_558 = true;
  std::__cxx11::string::string(local_660,"kernel svm",&local_8c2);
  std::__cxx11::string::_M_assign(local_598);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&new_options,(typed_option<bool> *)&loss_function);
  std::__cxx11::string::string((string *)&local_680,"reprocess",&local_8c3);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_528,&local_680,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->reprocess);
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_528,1);
  std::__cxx11::string::string(local_6a0,"number of reprocess steps for LASVM",&local_8c4);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar3,ptVar4);
  std::__cxx11::string::string((string *)&local_6c0,"pool_greedy",&local_8c5);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_488,&local_6c0,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active_pool_greedy);
  std::__cxx11::string::string(local_6e0,"use greedy selection on mini pools",&local_8c6);
  std::__cxx11::string::_M_assign((string *)(local_488 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_488);
  std::__cxx11::string::string((string *)&local_700,"para_active",&local_8c7);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_348,&local_700,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->para_active);
  std::__cxx11::string::string(local_720,"do parallel active learning",&local_8c8);
  std::__cxx11::string::_M_assign((string *)(local_348 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_348);
  std::__cxx11::string::string((string *)&local_740,"pool_size",&local_8c9);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_c8,&local_740,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size);
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_c8,1);
  std::__cxx11::string::string(local_760,"size of pools for active learning",&local_8ca);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar3,ptVar4);
  std::__cxx11::string::string((string *)&local_780,"subsample",&local_8cb);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_168,&local_780,
             &(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->subsample);
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_168,1);
  std::__cxx11::string::string(local_7a0,"number of items to subsample from the pool",&local_8cc);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar3,ptVar4);
  std::__cxx11::string::string((string *)&local_7c0,"kernel",&local_8cd);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_3e8,&local_7c0,&kernel_type);
  local_3e8.super_base_option.m_keep = true;
  std::__cxx11::string::string((string *)&local_7e0,"linear",&local_8ce);
  op = VW::config::
       typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::default_value(&local_3e8,&local_7e0);
  std::__cxx11::string::string(local_800,"type of kernel (rbf or linear (default))",&local_8cf);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar3,op);
  std::__cxx11::string::string((string *)&local_820,"bandwidth",&local_8d0);
  VW::config::typed_option<float>::typed_option(&local_208,&local_820,&bandwidth);
  local_208.super_base_option.m_keep = true;
  op_00 = VW::config::typed_option<float>::default_value(&local_208,1.0);
  std::__cxx11::string::string(local_840,"bandwidth of rbf kernel",&local_8d1);
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,op_00);
  std::__cxx11::string::string((string *)&local_860,"degree",&local_8d2);
  VW::config::typed_option<int>::typed_option(&local_2a8,&local_860,&degree);
  local_2a8.super_base_option.m_keep = true;
  op_01 = VW::config::typed_option<int>::default_value(&local_2a8,2);
  std::__cxx11::string::string(local_880,"degree of poly kernel",&local_8d3);
  std::__cxx11::string::_M_assign((string *)&(op_01->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar3,op_01);
  std::__cxx11::string::~string(local_880);
  VW::config::typed_option<int>::~typed_option(&local_2a8);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string(local_840);
  VW::config::typed_option<float>::~typed_option(&local_208);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string(local_800);
  std::__cxx11::string::~string((string *)&local_7e0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_3e8);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string(local_7a0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string(local_760);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_740);
  std::__cxx11::string::~string(local_720);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_348);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string(local_6e0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_488);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::~string(local_6a0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_528);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string(local_660);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&loss_function);
  std::__cxx11::string::~string((string *)&local_640);
  (**options->_vptr_options_i)(options,&new_options);
  if (ksvm == false) {
    plVar12 = (learner<svm_params,_example> *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&loss_function,"hinge",(allocator *)&local_528);
    if (all->loss != (loss_function *)0x0) {
      (*all->loss->_vptr_loss_function[9])();
    }
    std::__cxx11::string::string((string *)&local_8a0,(string *)&loss_function);
    plVar5 = getLossFunction(all,&local_8a0,0.0);
    all->loss = plVar5;
    std::__cxx11::string::~string((string *)&local_8a0);
    psVar6 = calloc_or_throw<svm_model>();
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->model = psVar6;
    psVar6->num_support = 0;
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->maxcache = 0x40000000;
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->loss_sum = 0.0;
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all = all;
    if (all->active == true) {
      (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active = true;
    }
    if ((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active == true) {
      (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->active_c = 1.0;
    }
    ppsVar7 = calloc_or_throw<svm_example*>
                        ((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                          super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                          super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size);
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool = ppsVar7;
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_pos = 0;
    std::__cxx11::string::string((string *)&local_528,"subsample",(allocator *)local_488);
    iVar2 = (*options->_vptr_options_i[1])(options,&local_528);
    if ((char)iVar2 == '\0') {
      bVar1 = (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->para_active;
      std::__cxx11::string::~string((string *)&local_528);
      if (bVar1 == true) {
        uVar8 = (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->pool_size /
                all->all_reduce->total;
        auVar14._8_4_ = (int)(uVar8 >> 0x20);
        auVar14._0_8_ = uVar8;
        auVar14._12_4_ = 0x45300000;
        dVar15 = (auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
        uVar8 = (ulong)dVar15;
        (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->subsample =
             (long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_528);
    }
    uVar13 = -(uint)(all->l2_lambda == 0.0);
    (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->lambda =
         (float)(~uVar13 & (uint)all->l2_lambda | uVar13 & 0x3f800000);
    poVar9 = std::operator<<(&((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t
                                .super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->
                              trace_message).super_ostream,"Lambda = ");
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (poVar9,(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t
                                .super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->lambda);
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(&((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t
                                .super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->
                              trace_message).super_ostream,"Kernel = ");
    poVar9 = std::operator<<(poVar9,(string *)&kernel_type);
    std::endl<char,std::char_traits<char>>(poVar9);
    iVar2 = std::__cxx11::string::compare((char *)&kernel_type);
    if (iVar2 == 0) {
      (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 1;
      poVar9 = std::operator<<(&((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>.
                                  _M_t.super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->
                                trace_message).super_ostream,"bandwidth = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,bandwidth);
      std::endl<char,std::char_traits<char>>(poVar9);
      pdVar10 = calloc_or_throw<double>();
      (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_params = pdVar10;
      *(float *)pdVar10 = bandwidth;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&kernel_type);
      if (iVar2 == 0) {
        (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 2;
        poVar9 = std::operator<<(&((params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>.
                                    _M_t.super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                                    super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->
                                  trace_message).super_ostream,"degree = ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,degree);
        std::endl<char,std::char_traits<char>>(poVar9);
        piVar11 = calloc_or_throw<int>();
        (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_params = piVar11;
        *piVar11 = degree;
      }
      else {
        (params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->kernel_type = 0;
      }
    }
    parameters::stride_shift
              (&(params._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_svm_params_*,_false>._M_head_impl)->all->weights,0);
    plVar12 = LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
                        (&params,learn,predict,1);
    *(code **)(plVar12 + 0x80) = save_load;
    *(undefined8 *)(plVar12 + 0x70) = *(undefined8 *)(plVar12 + 0x18);
    *(undefined8 *)(plVar12 + 0x78) = *(undefined8 *)(plVar12 + 0x20);
    *(undefined8 *)(plVar12 + 0xb8) = *(undefined8 *)(plVar12 + 0x18);
    *(undefined8 *)(plVar12 + 0xc0) = *(undefined8 *)(plVar12 + 0x20);
    *(code **)(plVar12 + 200) = finish;
    std::__cxx11::string::~string((string *)&loss_function);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&kernel_type);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::~unique_ptr(&params);
  return (base_learner *)plVar12;
}

Assistant:

LEARNER::base_learner* kernel_svm_setup(options_i& options, vw& all)
{
  auto params = scoped_calloc_or_throw<svm_params>();
  std::string kernel_type;
  float bandwidth = 1.f;
  int degree = 2;

  bool ksvm = false;

  option_group_definition new_options("Kernel SVM");
  new_options.add(make_option("ksvm", ksvm).keep().help("kernel svm"))
      .add(make_option("reprocess", params->reprocess).default_value(1).help("number of reprocess steps for LASVM"))
      .add(make_option("pool_greedy", params->active_pool_greedy).help("use greedy selection on mini pools"))
      .add(make_option("para_active", params->para_active).help("do parallel active learning"))
      .add(make_option("pool_size", params->pool_size).default_value(1).help("size of pools for active learning"))
      .add(make_option("subsample", params->subsample)
               .default_value(1)
               .help("number of items to subsample from the pool"))
      .add(make_option("kernel", kernel_type)
               .keep()
               .default_value("linear")
               .help("type of kernel (rbf or linear (default))"))
      .add(make_option("bandwidth", bandwidth).keep().default_value(1.f).help("bandwidth of rbf kernel"))
      .add(make_option("degree", degree).keep().default_value(2).help("degree of poly kernel"));
  options.add_and_parse(new_options);

  if (!ksvm)
  {
    return nullptr;
  }

  string loss_function = "hinge";
  float loss_parameter = 0.0;
  delete all.loss;
  all.loss = getLossFunction(all, loss_function, (float)loss_parameter);

  params->model = &calloc_or_throw<svm_model>();
  params->model->num_support = 0;
  params->maxcache = 1024 * 1024 * 1024;
  params->loss_sum = 0.;
  params->all = &all;

  // This param comes from the active reduction.
  // During options refactor: this changes the semantics a bit - now this will only be true if --active was supplied and
  // NOT --simulation
  if (all.active)
    params->active = true;
  if (params->active)
    params->active_c = 1.;

  params->pool = calloc_or_throw<svm_example*>(params->pool_size);
  params->pool_pos = 0;

  if (!options.was_supplied("subsample") && params->para_active)
    params->subsample = (size_t)ceil(params->pool_size / all.all_reduce->total);

  params->lambda = all.l2_lambda;
  if (params->lambda == 0.)
    params->lambda = 1.;
  params->all->trace_message << "Lambda = " << params->lambda << endl;
  params->all->trace_message << "Kernel = " << kernel_type << endl;

  if (kernel_type.compare("rbf") == 0)
  {
    params->kernel_type = SVM_KER_RBF;
    params->all->trace_message << "bandwidth = " << bandwidth << endl;
    params->kernel_params = &calloc_or_throw<double>();
    *((float*)params->kernel_params) = bandwidth;
  }
  else if (kernel_type.compare("poly") == 0)
  {
    params->kernel_type = SVM_KER_POLY;
    params->all->trace_message << "degree = " << degree << endl;
    params->kernel_params = &calloc_or_throw<int>();
    *((int*)params->kernel_params) = degree;
  }
  else
    params->kernel_type = SVM_KER_LIN;

  params->all->weights.stride_shift(0);

  learner<svm_params, example>& l = init_learner(params, learn, predict, 1);
  l.set_save_load(save_load);
  l.set_finish(finish);
  return make_base(l);
}